

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::LogToSinks
               (LogSeverity severity,char *full_filename,char *base_filename,int line,tm *tm_time,
               char *message,size_t message_len)

{
  long *plVar1;
  ulong uVar2;
  
  ::glog_internal_namespace_::Mutex::ReaderLock((Mutex *)sink_mutex_);
  if (sinks_ != (long *)0x0) {
    uVar2 = (ulong)(sinks_[1] - *sinks_) >> 3 & 0xffffffff;
    while( true ) {
      uVar2 = uVar2 - 1;
      if ((int)(uint)uVar2 < 0) break;
      plVar1 = *(long **)(*sinks_ + (ulong)((uint)uVar2 & 0x7fffffff) * 8);
      (**(code **)(*plVar1 + 0x10))
                (plVar1,severity,full_filename,base_filename,line,tm_time,message,message_len);
    }
  }
  ::glog_internal_namespace_::Mutex::ReaderUnlock((Mutex *)sink_mutex_);
  return;
}

Assistant:

inline void LogDestination::LogToSinks(LogSeverity severity,
                                       const char *full_filename,
                                       const char *base_filename,
                                       int line,
                                       const struct ::tm* tm_time,
                                       const char* message,
                                       size_t message_len) {
  ReaderMutexLock l(&sink_mutex_);
  if (sinks_) {
    for (int i = sinks_->size() - 1; i >= 0; i--) {
      (*sinks_)[i]->send(severity, full_filename, base_filename,
                         line, tm_time, message, message_len);
    }
  }
}